

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_scalar_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::VolumeMeshVertexScalarQuantity::VolumeMeshVertexScalarQuantity
          (VolumeMeshVertexScalarQuantity *this,string *name,
          vector<float,_std::allocator<float>_> *values_,VolumeMesh *mesh_,DataType dataType_)

{
  allocator local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  std::__cxx11::string::string((string *)&local_60,"vertex",&local_61);
  VolumeMeshScalarQuantity::VolumeMeshScalarQuantity
            (&this->super_VolumeMeshScalarQuantity,&local_40,mesh_,&local_60,values_,dataType_);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
  super_QuantityS<polyscope::VolumeMesh>.super_Quantity._vptr_Quantity =
       (_func_int **)&PTR__VolumeMeshVertexScalarQuantity_00598c98;
  (this->super_VolumeMeshScalarQuantity).super_ScalarQuantity<polyscope::VolumeMeshScalarQuantity>.
  _vptr_ScalarQuantity = (_func_int **)&DAT_00598d38;
  (this->levelSetProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->levelSetProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->levelSetProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 5) = 0;
  this->showQuantity = this;
  VolumeMesh::refreshVolumeMeshListeners
            ((this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
             super_QuantityS<polyscope::VolumeMesh>.parent);
  return;
}

Assistant:

VolumeMeshVertexScalarQuantity::VolumeMeshVertexScalarQuantity(std::string name, const std::vector<float>& values_,
                                                               VolumeMesh& mesh_, DataType dataType_)
    : VolumeMeshScalarQuantity(name, mesh_, "vertex", values_, dataType_), levelSetValue(0), isDrawingLevelSet(false),
      showQuantity(this)

{
  parent.refreshVolumeMeshListeners(); // just in case this quantity is being drawn
}